

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

float16 float16_muladd_mips(float16 a,float16 b,float16 c,int flags,float_status *status)

{
  long lVar1;
  byte bVar2;
  float16 fVar3;
  byte bVar4;
  uint uVar5;
  undefined4 in_register_0000000c;
  uint uVar6;
  int count;
  uint uVar7;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  uint64_t uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  FloatParts FVar19;
  FloatParts FVar20;
  FloatParts c_00;
  FloatParts a_00;
  FloatParts b_00;
  ulong local_70;
  uint local_64;
  ulong local_60;
  uint64_t local_58;
  ulong local_50;
  ulong local_48;
  uint64_t c_lo;
  uint64_t c_hi;
  ulong uVar8;
  
  local_50 = CONCAT44(in_register_0000000c,flags);
  FVar19 = float16a_unpack_canonical(a,status,&float16_params);
  uVar8 = FVar19._8_8_;
  local_58 = FVar19.frac;
  FVar20 = float16a_unpack_canonical(b,status,&float16_params);
  uVar10 = FVar20._8_8_;
  c_00 = float16a_unpack_canonical(c,status,&float16_params);
  uVar9 = c_00._8_8_;
  uVar12 = c_00.frac;
  uVar6 = 1 << (FVar20.cls & 0x1f) | 1 << (FVar19._12_4_ & 0x1f);
  if (((uVar8 | uVar10 | uVar9) & 0xfc00000000) != 0) {
    uVar10 = uVar10 & 0xffffffffffff;
    a_00.exp = (int)uVar8;
    a_00.cls = (char)(uVar8 >> 0x20);
    a_00.sign = (_Bool)(char)(uVar8 >> 0x28);
    a_00._14_2_ = (short)(uVar8 >> 0x30);
    a_00.frac = local_58;
    b_00.exp = (int)uVar10;
    b_00.cls = (char)(uVar10 >> 0x20);
    b_00.sign = (_Bool)(char)(uVar10 >> 0x28);
    b_00._14_2_ = (short)(uVar10 >> 0x30);
    b_00.frac = FVar20.frac;
    FVar19 = pick_nan_muladd(a_00,b_00,c_00,uVar6 == 10,status);
    goto LAB_0069304c;
  }
  if (uVar6 != 10) {
    uVar6 = FVar19._12_4_ & 0xff;
    uVar14 = (uint)local_50 & 4;
    uVar11 = 0x10000000000;
    uVar18 = uVar9 & 0xffff0103ffffffff ^ 0x10000000000;
    if ((local_50 & 1) == 0) {
      uVar18 = uVar9;
    }
    uVar9 = (uVar10 ^ uVar8) & 0x10000000000;
    uVar10 = (ulong)(uVar9 == 0);
    if ((local_50 & 2) == 0) {
      uVar10 = uVar9 >> 0x28;
    }
    uVar7 = (uint)(uVar18 >> 0x20);
    uVar13 = (uint)uVar10;
    local_60 = uVar8;
    if ((uVar6 != 3) && (uVar5 = FVar20._12_4_ & 0xff, uVar5 != 3)) {
      uVar16 = uVar7 & 3;
      if (uVar16 == 3) {
        uVar6 = uVar7 >> 8 & 1;
LAB_00692ff7:
        if (uVar6 == uVar14 >> 2) {
          uVar11 = 0;
        }
        uVar11 = uVar11 | uVar8 & 0xffff0000ffffffff | 0x300000000;
        goto LAB_00693047;
      }
      uVar17 = (uint)uVar18;
      if ((uVar6 == 1) || (uVar5 == 1)) {
        if (uVar16 == 1) {
          if ((uVar7 >> 8 & 1) != uVar13) {
            uVar10 = (ulong)(status->float_rounding_mode == '\x01');
          }
          uVar18 = uVar18 & 0xffff0003ffffffff | uVar10 << 0x28;
        }
        else if ((local_50 & 8) != 0) {
          uVar18 = uVar18 & 0xffffff0300000000 | (ulong)(uVar17 - 1);
        }
        if (((uint)(uVar18 >> 0x28) & 1) == uVar14 >> 2) {
          uVar11 = 0;
        }
        uVar11 = uVar11 | uVar18 & 0xffff00ffffffffff;
        FVar19.exp = (int)uVar11;
        FVar19.cls = (char)(uVar11 >> 0x20);
        FVar19.sign = (_Bool)(char)(uVar11 >> 0x28);
        FVar19._14_2_ = (short)(uVar11 >> 0x30);
        FVar19.frac = uVar12;
        goto LAB_0069304c;
      }
      local_64 = uVar13;
      if ((uVar6 != 2) || (uVar5 != 2)) {
        __assert_fail("a.cls == float_class_normal && b.cls == float_class_normal",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                      ,0x58e,
                      "FloatParts muladd_floats(FloatParts, FloatParts, FloatParts, int, float_status *)"
                     );
      }
      uVar6 = FVar20.exp + FVar19.exp;
      mul64To128(local_58,FVar20.frac,&local_48,&local_70);
      if ((local_48 >> 0x3d & 1) != 0) {
        local_70 = (ulong)((uint)local_70 & 1) | local_48 << 0x3f | local_70 >> 1;
        local_48 = local_48 >> 1;
        uVar6 = uVar6 + 1;
      }
      uVar8 = local_48;
      if (uVar16 == 1) {
        uVar15 = (ulong)((local_70 & 0x3fffffffffffffff) != 0) | local_48 << 2 | local_70 >> 0x3e;
      }
      else {
        count = uVar6 - uVar17;
        if ((uVar7 >> 8 & 1) == (local_64 & 0xff)) {
          if (count < 1) {
            shift128RightJamming(local_48,local_70,0x3e - count,&local_48,&local_70);
            uVar15 = uVar12 + local_70;
          }
          else {
            c_hi = uVar12 >> 2;
            c_lo = 0;
            shift128RightJamming(c_hi,0,count,&c_hi,&c_lo);
            uVar15 = (ulong)((c_lo + local_70 & 0x3fffffffffffffff) != 0) |
                     (uVar8 + c_hi + (ulong)CARRY8(c_lo,local_70)) * 4 | c_lo + local_70 >> 0x3e;
            uVar18 = (ulong)uVar6;
          }
          uVar6 = (uint)uVar18;
          if ((long)uVar15 < 0) {
            uVar15 = (ulong)((uint)uVar15 & 1) | uVar15 >> 1;
            uVar6 = uVar6 + 1;
          }
        }
        else {
          uVar12 = uVar12 >> 2;
          c_lo = 0;
          c_hi = uVar12;
          if (count < 1) {
            shift128RightJamming(local_48,local_70,-count,&local_48,&local_70);
            uVar10 = local_48 - uVar12;
            uVar8 = local_70;
            if (local_48 < uVar12 || uVar6 != uVar17) {
              uVar10 = (uVar12 - local_48) - (ulong)(local_70 != 0);
              local_64 = local_64 ^ 1;
              uVar8 = -local_70;
              uVar6 = uVar17;
            }
          }
          else {
            shift128RightJamming(uVar12,0,count,&c_hi,&c_lo);
            uVar10 = (uVar8 - c_hi) - (ulong)(local_70 < c_lo);
            uVar8 = local_70 - c_lo;
          }
          if (uVar10 == 0 && uVar8 == 0) {
            uVar12 = 0x10000000000;
            if (uVar14 >> 2 == (uint)(status->float_rounding_mode == '\x01')) {
              uVar12 = 0;
            }
            FVar19._8_8_ = (uVar12 | local_60 & 0xffff0000ffffffff) + 0x100000000;
            FVar19.frac = local_58;
            goto LAB_0069304c;
          }
          if (uVar10 == 0) {
            if (uVar8 == 0) {
              uVar12 = 0x40;
            }
            else {
              uVar12 = 0x3f;
              if (uVar8 != 0) {
                for (; uVar8 >> uVar12 == 0; uVar12 = uVar12 - 1) {
                }
              }
              uVar12 = uVar12 ^ 0x3f;
            }
            if (uVar12 == 0) {
              uVar7 = 0x40;
              goto LAB_0069336b;
            }
            uVar7 = (int)uVar12 + 0x40;
            uVar15 = uVar8 << ((char)uVar12 - 1U & 0x3f);
          }
          else {
            lVar1 = 0x3f;
            if (uVar10 != 0) {
              for (; uVar10 >> lVar1 == 0; lVar1 = lVar1 + -1) {
              }
            }
            uVar7 = (uint)lVar1 ^ 0x3f;
LAB_0069336b:
            bVar4 = (char)uVar7 - 1;
            bVar2 = bVar4 & 0x3f;
            uVar15 = (ulong)(uVar8 << (bVar4 & 0x3f) != 0) | uVar10 << bVar2 | uVar8 >> 0x40 - bVar2
            ;
          }
          uVar6 = (uVar6 - uVar7) + 3;
        }
      }
      uVar12 = 0x10000000000;
      if (uVar14 >> 2 == (local_64 & 0xff)) {
        uVar12 = 0;
      }
      uVar12 = uVar12 | local_60 & 0xffff000000000000 |
               (ulong)((((int)local_50 << 0x1c) >> 0x1f) + uVar6) | 0x200000000;
      FVar19.exp = (int)uVar12;
      FVar19.cls = (char)(uVar12 >> 0x20);
      FVar19.sign = (_Bool)(char)(uVar12 >> 0x28);
      FVar19._14_2_ = (short)(uVar12 >> 0x30);
      FVar19.frac = uVar15;
      goto LAB_0069304c;
    }
    if ((~uVar18 & 0x300000000) != 0) {
      if (uVar14 >> 2 == uVar13) {
        uVar11 = 0;
      }
      uVar11 = uVar11 | uVar8 & 0xffff0000ffffffff | 0x300000000;
LAB_00693047:
      FVar19.exp = (int)uVar11;
      FVar19.cls = (char)(uVar11 >> 0x20);
      FVar19.sign = (_Bool)(char)(uVar11 >> 0x28);
      FVar19._14_2_ = (short)(uVar11 >> 0x30);
      FVar19.frac = local_58;
      goto LAB_0069304c;
    }
    uVar6 = uVar7 >> 8 & 1;
    if (uVar6 == uVar13) goto LAB_00692ff7;
  }
  status->float_exception_flags = status->float_exception_flags | 1;
  uVar15 = 0x1fffffffffffffff;
  if (status->snan_bit_is_one == '\0') {
    uVar15 = 0x2000000000000000;
  }
  FVar19.exp = 0x7fffffff;
  FVar19.cls = float_class_qnan;
  FVar19.sign = false;
  FVar19._14_2_ = 0;
  FVar19.frac = uVar15;
LAB_0069304c:
  fVar3 = float16a_round_pack_canonical(FVar19,status,&float16_params);
  return fVar3;
}

Assistant:

float16 QEMU_FLATTEN float16_muladd(float16 a, float16 b, float16 c,
                                                int flags, float_status *status)
{
    FloatParts pa = float16_unpack_canonical(a, status);
    FloatParts pb = float16_unpack_canonical(b, status);
    FloatParts pc = float16_unpack_canonical(c, status);
    FloatParts pr = muladd_floats(pa, pb, pc, flags, status);

    return float16_round_pack_canonical(pr, status);
}